

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
xemmai::t_parser::f_block
          (t_parser *this,
          vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
          *a_nodes)

{
  tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> in_RAX;
  ulong uVar1;
  wchar_t *pwVar2;
  pointer *__ptr;
  ulong uVar3;
  wstring_view a_message;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> local_28;
  
  uVar3 = (long)(this->v_lexer).v_indent.v_i + (-0x50 - (long)(this->v_lexer).v_indent.v_p) >> 2;
  local_28._M_head_impl =
       (t_node *)
       in_RAX.
       super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
       super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  while( true ) {
    f_expression((t_parser *)&stack0xffffffffffffffd8);
    std::
    vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
    ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                *)a_nodes,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               &stack0xffffffffffffffd8);
    if ((t_script *)local_28._M_head_impl != (t_script *)0x0) {
      (*((t_body *)&(local_28._M_head_impl)->_vptr_t_node)->_vptr_t_body[1])();
    }
    if ((this->v_lexer).v_newline == false) break;
    uVar1 = (long)(this->v_lexer).v_indent.v_i + (-0x50 - (long)(this->v_lexer).v_indent.v_p) >> 2;
    if (uVar1 != uVar3) {
      if (uVar1 <= uVar3) {
        return;
      }
      pwVar2 = L"unexpected indent.";
LAB_0016a3a8:
      a_message._M_str = pwVar2;
      a_message._M_len = 0x12;
      f_throw(this,a_message);
    }
  }
  pwVar2 = L"expecting newline.";
  goto LAB_0016a3a8;
}

Assistant:

void t_parser::f_block(std::vector<std::unique_ptr<ast::t_node>>& a_nodes)
{
	size_t indent = v_lexer.f_indent();
	do {
		a_nodes.push_back(f_expression());
		if (!v_lexer.f_newline()) f_throw(L"expecting newline."sv);
	} while (v_lexer.f_indent() == indent);
	if (v_lexer.f_indent() > indent) f_throw(L"unexpected indent."sv);
}